

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O3

btCollisionObject * __thiscall
btCollisionWorldImporter::createCollisionObject
          (btCollisionWorldImporter *this,btTransform *startTransform,btCollisionShape *shape,
          char *bodyName)

{
  btCollisionObject **ptr;
  btScalar bVar1;
  btScalar bVar2;
  btScalar bVar3;
  undefined8 uVar4;
  uint uVar5;
  anon_union_8_2_511b660c_for_btHashPtr_0 this_00;
  char *pcVar6;
  btCollisionObject **ppbVar7;
  char cVar8;
  ulong uVar9;
  int iVar10;
  btCollisionObject *colObj;
  char *newname;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_50;
  anon_union_8_2_511b660c_for_btHashPtr_0 local_48;
  uint local_40;
  char *local_38;
  
  this_00.m_pointer = btAlignedAllocInternal(0x150,0x10);
  btCollisionObject::btCollisionObject((btCollisionObject *)this_00.m_pointer);
  *(int *)((long)this_00.m_pointer + 0x148) = *(int *)((long)this_00.m_pointer + 0x148) + 1;
  uVar4 = *(undefined8 *)((startTransform->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(((btTransform *)((long)this_00.m_pointer + 8))->m_basis).m_el[0].m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[0].m_floats;
  *(undefined8 *)((long)this_00.m_pointer + 0x10) = uVar4;
  uVar4 = *(undefined8 *)((startTransform->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)((btVector3 *)((long)this_00.m_pointer + 0x18))->m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[1].m_floats;
  *(undefined8 *)((long)this_00.m_pointer + 0x20) = uVar4;
  uVar4 = *(undefined8 *)((startTransform->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)((btVector3 *)((long)this_00.m_pointer + 0x28))->m_floats =
       *(undefined8 *)(startTransform->m_basis).m_el[2].m_floats;
  *(undefined8 *)((long)this_00.m_pointer + 0x30) = uVar4;
  bVar1 = (startTransform->m_origin).m_floats[1];
  bVar2 = (startTransform->m_origin).m_floats[2];
  bVar3 = (startTransform->m_origin).m_floats[3];
  ((btVector3 *)((long)this_00.m_pointer + 0x38))->m_floats[0] =
       (startTransform->m_origin).m_floats[0];
  *(btScalar *)((long)this_00.m_pointer + 0x3c) = bVar1;
  *(btScalar *)((long)this_00.m_pointer + 0x40) = bVar2;
  *(btScalar *)((long)this_00.m_pointer + 0x44) = bVar3;
  local_50.m_pointer = this_00.m_pointer;
  (**(code **)(*this_00.m_pointer + 0x10))(this_00.m_pointer,shape);
  (*this->m_collisionWorld->_vptr_btCollisionWorld[9])
            (this->m_collisionWorld,this_00.m_pointer,1,0xffffffff);
  if (bodyName != (char *)0x0) {
    local_38 = duplicateName(this,bodyName);
    local_48.m_pointer = this_00.m_pointer;
    btHashMap<btHashPtr,_const_char_*>::insert
              (&this->m_objectNameMap,(btHashPtr *)&local_48,&local_38);
    local_48.m_pointer = local_38;
    cVar8 = *local_38;
    if (cVar8 == '\0') {
      local_40 = 0x811c9dc5;
    }
    else {
      local_40 = 0x811c9dc5;
      pcVar6 = local_38;
      do {
        pcVar6 = pcVar6 + 1;
        local_40 = ((int)cVar8 ^ local_40) * 0x1000193;
        cVar8 = *pcVar6;
      } while (cVar8 != '\0');
    }
    btHashMap<btHashString,_btCollisionObject_*>::insert
              (&this->m_nameColObjMap,(btHashString *)&local_48,
               (btCollisionObject **)&local_50.m_pointer);
  }
  uVar5 = (this->m_allocatedCollisionObjects).m_size;
  if (uVar5 == (this->m_allocatedCollisionObjects).m_capacity) {
    iVar10 = 1;
    if (uVar5 != 0) {
      iVar10 = uVar5 * 2;
    }
    if ((int)uVar5 < iVar10) {
      if (iVar10 == 0) {
        ppbVar7 = (btCollisionObject **)0x0;
      }
      else {
        ppbVar7 = (btCollisionObject **)btAlignedAllocInternal((long)iVar10 << 3,0x10);
        uVar5 = (this->m_allocatedCollisionObjects).m_size;
      }
      if (0 < (int)uVar5) {
        uVar9 = 0;
        do {
          ppbVar7[uVar9] = (this->m_allocatedCollisionObjects).m_data[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar5 != uVar9);
      }
      ptr = (this->m_allocatedCollisionObjects).m_data;
      if ((ptr != (btCollisionObject **)0x0) &&
         ((this->m_allocatedCollisionObjects).m_ownsMemory == true)) {
        btAlignedFreeInternal(ptr);
        uVar5 = (this->m_allocatedCollisionObjects).m_size;
      }
      (this->m_allocatedCollisionObjects).m_ownsMemory = true;
      (this->m_allocatedCollisionObjects).m_data = ppbVar7;
      (this->m_allocatedCollisionObjects).m_capacity = iVar10;
    }
  }
  ((anon_union_8_2_511b660c_for_btHashPtr_0 *)
  ((this->m_allocatedCollisionObjects).m_data + (int)uVar5))->m_pointer = (void *)local_50;
  (this->m_allocatedCollisionObjects).m_size = uVar5 + 1;
  return (btCollisionObject *)local_50.m_pointer;
}

Assistant:

btCollisionObject* btCollisionWorldImporter::createCollisionObject(const btTransform& startTransform,btCollisionShape* shape, const char* bodyName)
{
	btCollisionObject* colObj = new btCollisionObject();
	colObj->setWorldTransform(startTransform);
	colObj->setCollisionShape(shape);
	m_collisionWorld->addCollisionObject(colObj);//todo: flags etc

	if (bodyName)
	{
		char* newname = duplicateName(bodyName);
		m_objectNameMap.insert(colObj,newname);
		m_nameColObjMap.insert(newname,colObj);
	}
	m_allocatedCollisionObjects.push_back(colObj);

	return colObj;
}